

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  Vdbe *v;
  undefined3 in_register_00000089;
  
  v = pParse->pVdbe;
  sqlite3ExprCodeGetColumnOfTable(v,pTab,iTable,iColumn,iReg);
  if ((CONCAT31(in_register_00000089,p5) != 0) && (0 < (long)v->nOp)) {
    v->aOp[(long)v->nOp + -1].p5 = (ushort)p5;
  }
  return iReg;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  Vdbe *v = pParse->pVdbe;
  assert( v!=0 );
  sqlite3ExprCodeGetColumnOfTable(v, pTab, iTable, iColumn, iReg);
  if( p5 ){
    sqlite3VdbeChangeP5(v, p5);
  }
  return iReg;
}